

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O3

int64_t aom_highbd_sse_avx2(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 (*pauVar5) [32];
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 *puVar10;
  int iVar11;
  undefined1 (*pauVar12) [32];
  long lVar13;
  int iVar14;
  undefined1 *puVar15;
  long lVar16;
  undefined1 *puVar17;
  long lVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  pauVar12 = (undefined1 (*) [32])((long)a8 * 2);
  pauVar5 = (undefined1 (*) [32])((long)b8 * 2);
  if (width < 0x20) {
    if (width == 4) {
      iVar11 = 0;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(*pauVar12 + (long)a_stride * 2);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)*pauVar12;
        auVar23 = vpunpcklqdq_avx(auVar27,auVar23);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(*pauVar12 + (long)(a_stride * 3) * 2);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(*pauVar12 + (long)(a_stride * 2) * 2);
        auVar27 = vpunpcklqdq_avx(auVar37,auVar28);
        auVar24._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar27;
        auVar24._16_16_ = ZEXT116(1) * auVar23;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(*pauVar5 + (long)b_stride * 2);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)*pauVar5;
        auVar23 = vpunpcklqdq_avx(auVar38,auVar29);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(*pauVar5 + (long)(b_stride * 3) * 2);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(*pauVar5 + (long)(b_stride * 2) * 2);
        auVar27 = vpunpcklqdq_avx(auVar45,auVar39);
        auVar31._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar27;
        auVar31._16_16_ = ZEXT116(1) * auVar23;
        auVar24 = vpsubw_avx2(auVar24,auVar31);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar24 = vpaddd_avx2(auVar24,auVar22._0_32_);
        auVar22 = ZEXT3264(auVar24);
        iVar11 = iVar11 + 4;
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + (long)(a_stride << 2) * 2);
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + (long)(b_stride << 2) * 2);
      } while (iVar11 < height);
    }
    else if (width == 8) {
      iVar11 = 0;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar25._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar12 + (long)a_stride * 2) +
             ZEXT116(1) * *(undefined1 (*) [16])*pauVar12;
        auVar25._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + (long)a_stride * 2);
        auVar35._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + (long)b_stride * 2) +
             ZEXT116(1) * *(undefined1 (*) [16])*pauVar5;
        auVar35._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + (long)b_stride * 2);
        auVar24 = vpsubw_avx2(auVar25,auVar35);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar24 = vpaddd_avx2(auVar24,auVar22._0_32_);
        auVar22 = ZEXT3264(auVar24);
        iVar11 = iVar11 + 2;
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + (long)(a_stride * 2) * 2);
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + (long)(b_stride * 2) * 2);
      } while (iVar11 < height);
    }
    else {
      if (width != 0x10) goto LAB_00374dc8;
      iVar11 = 1;
      if (1 < height) {
        iVar11 = height;
      }
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar24 = vpsubw_avx2(*pauVar12,*pauVar5);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar24 = vpaddd_avx2(auVar24,auVar22._0_32_);
        auVar22 = ZEXT3264(auVar24);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + (long)a_stride * 2);
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + (long)b_stride * 2);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    auVar31 = vpunpckldq_avx2(auVar24,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar24 = vpunpckhdq_avx2(auVar24,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar24 = vpaddq_avx2(auVar31,auVar24);
  }
  else {
    if (width == 0x20) {
      iVar11 = 0;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        iVar14 = 1;
        do {
          auVar24 = vpsubw_avx2(*pauVar12,*pauVar5);
          auVar24 = vpmaddwd_avx2(auVar24,auVar24);
          auVar24 = vpaddd_avx2(auVar24,auVar26._0_32_);
          auVar31 = vpsubw_avx2(pauVar12[1],pauVar5[1]);
          auVar31 = vpmaddwd_avx2(auVar31,auVar31);
          auVar24 = vpaddd_avx2(auVar24,auVar31);
          auVar26 = ZEXT3264(auVar24);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + (long)a_stride * 2);
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + (long)b_stride * 2);
          if (0x3e < iVar14 - 1U) break;
          bVar1 = iVar14 < height - iVar11;
          iVar14 = iVar14 + 1;
        } while (bVar1);
        auVar31 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar31 = vpaddq_avx2(auVar22._0_32_,auVar31);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar31,auVar24);
        auVar22 = ZEXT3264(auVar24);
        iVar11 = iVar11 + 0x40;
      } while (iVar11 < height);
      goto LAB_00375129;
    }
    if (width == 0x40) {
      iVar11 = 0;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        iVar14 = 1;
        do {
          auVar24 = vpsubw_avx2(*pauVar12,*pauVar5);
          auVar24 = vpmaddwd_avx2(auVar24,auVar24);
          auVar24 = vpaddd_avx2(auVar24,auVar26._0_32_);
          auVar31 = vpsubw_avx2(pauVar12[1],pauVar5[1]);
          auVar31 = vpmaddwd_avx2(auVar31,auVar31);
          auVar25 = vpsubw_avx2(pauVar12[2],pauVar5[2]);
          auVar25 = vpmaddwd_avx2(auVar25,auVar25);
          auVar31 = vpaddd_avx2(auVar31,auVar25);
          auVar24 = vpaddd_avx2(auVar24,auVar31);
          auVar31 = vpsubw_avx2(pauVar12[3],pauVar5[3]);
          auVar31 = vpmaddwd_avx2(auVar31,auVar31);
          auVar24 = vpaddd_avx2(auVar24,auVar31);
          auVar26 = ZEXT3264(auVar24);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + (long)a_stride * 2);
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + (long)b_stride * 2);
          if (0x1e < iVar14 - 1U) break;
          bVar1 = iVar14 < height - iVar11;
          iVar14 = iVar14 + 1;
        } while (bVar1);
        auVar31 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar31 = vpaddq_avx2(auVar22._0_32_,auVar31);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar31,auVar24);
        auVar22 = ZEXT3264(auVar24);
        iVar11 = iVar11 + 0x20;
      } while (iVar11 < height);
      goto LAB_00375129;
    }
    if (width == 0x80) {
      iVar11 = 0;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        iVar14 = 1;
        do {
          auVar24 = vpsubw_avx2(*pauVar12,*pauVar5);
          auVar24 = vpmaddwd_avx2(auVar24,auVar24);
          auVar24 = vpaddd_avx2(auVar24,auVar26._0_32_);
          auVar31 = vpsubw_avx2(pauVar12[1],pauVar5[1]);
          auVar31 = vpmaddwd_avx2(auVar31,auVar31);
          auVar25 = vpsubw_avx2(pauVar12[2],pauVar5[2]);
          auVar25 = vpmaddwd_avx2(auVar25,auVar25);
          auVar31 = vpaddd_avx2(auVar31,auVar25);
          auVar24 = vpaddd_avx2(auVar24,auVar31);
          auVar31 = vpsubw_avx2(pauVar12[3],pauVar5[3]);
          auVar31 = vpmaddwd_avx2(auVar31,auVar31);
          auVar25 = vpsubw_avx2(pauVar12[4],pauVar5[4]);
          auVar25 = vpmaddwd_avx2(auVar25,auVar25);
          auVar31 = vpaddd_avx2(auVar31,auVar25);
          auVar25 = vpsubw_avx2(pauVar12[5],pauVar5[5]);
          auVar25 = vpmaddwd_avx2(auVar25,auVar25);
          auVar31 = vpaddd_avx2(auVar31,auVar25);
          auVar24 = vpaddd_avx2(auVar24,auVar31);
          auVar31 = vpsubw_avx2(pauVar12[6],pauVar5[6]);
          auVar31 = vpmaddwd_avx2(auVar31,auVar31);
          auVar25 = vpsubw_avx2(pauVar12[7],pauVar5[7]);
          auVar25 = vpmaddwd_avx2(auVar25,auVar25);
          auVar31 = vpaddd_avx2(auVar31,auVar25);
          auVar24 = vpaddd_avx2(auVar24,auVar31);
          auVar26 = ZEXT3264(auVar24);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + (long)a_stride * 2);
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + (long)b_stride * 2);
          if (0xe < iVar14 - 1U) break;
          bVar1 = iVar14 < height - iVar11;
          iVar14 = iVar14 + 1;
        } while (bVar1);
        auVar31 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar31 = vpaddq_avx2(auVar22._0_32_,auVar31);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar31,auVar24);
        auVar22 = ZEXT3264(auVar24);
        iVar11 = iVar11 + 0x10;
      } while (iVar11 < height);
      goto LAB_00375129;
    }
LAB_00374dc8:
    lVar4 = (long)(b_stride * 2);
    if ((width & 7U) == 0) {
      iVar11 = 0;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        uVar9 = 0;
        do {
          lVar18 = 0;
          do {
            auVar36._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar12 + lVar18 * 2 + (long)a_stride * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + lVar18 * 2);
            auVar36._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + lVar18 * 2 + (long)a_stride * 2);
            auVar44._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + lVar18 * 2 + (long)b_stride * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + lVar18 * 2);
            auVar44._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + lVar18 * 2 + (long)b_stride * 2);
            auVar24 = vpsubw_avx2(auVar36,auVar44);
            auVar24 = vpmaddwd_avx2(auVar24,auVar24);
            auVar24 = vpaddd_avx2(auVar24,auVar26._0_32_);
            auVar26 = ZEXT3264(auVar24);
            lVar18 = lVar18 + 8;
          } while (lVar18 < width);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + (long)(a_stride * 2) * 2);
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + lVar4 * 2);
        } while ((uVar9 < 6) && (uVar9 = uVar9 + 2, (int)uVar9 < height - iVar11));
        auVar31 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar31 = vpaddq_avx2(auVar22._0_32_,auVar31);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar31,auVar24);
        auVar22 = ZEXT3264(auVar24);
        iVar11 = iVar11 + 8;
      } while (iVar11 < height);
    }
    else {
      lVar13 = (long)a_stride;
      lVar16 = (long)b_stride;
      lVar6 = (long)(a_stride * 2);
      lVar18 = (long)(b_stride << 2) * 2;
      puVar17 = *pauVar5 + lVar16 * 2;
      puVar19 = *pauVar5 + lVar4 * 2;
      puVar10 = *pauVar5 + lVar4 * 2 + lVar16 * 2;
      lVar2 = (long)(a_stride << 2) * 2;
      puVar20 = *pauVar12 + lVar13 * 2;
      puVar21 = *pauVar12 + lVar6 * 2;
      puVar15 = *pauVar12 + lVar6 * 2 + lVar13 * 2;
      iVar11 = 0;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        uVar7 = 0;
        do {
          auVar32._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar20 + uVar7 * 2) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + uVar7 * 2);
          auVar32._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar20 + uVar7 * 2);
          auVar41._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar17 + uVar7 * 2) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + uVar7 * 2);
          auVar41._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar17 + uVar7 * 2);
          auVar24 = vpsubw_avx2(auVar32,auVar41);
          auVar24 = vpmaddwd_avx2(auVar24,auVar24);
          auVar24 = vpaddd_avx2(auVar24,auVar26._0_32_);
          auVar33._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar15 + uVar7 * 2) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar21 + uVar7 * 2);
          auVar33._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar15 + uVar7 * 2);
          auVar42._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar10 + uVar7 * 2) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar19 + uVar7 * 2);
          auVar42._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar10 + uVar7 * 2);
          auVar31 = vpsubw_avx2(auVar33,auVar42);
          auVar31 = vpmaddwd_avx2(auVar31,auVar31);
          auVar24 = vpaddd_avx2(auVar24,auVar31);
          auVar26 = ZEXT3264(auVar24);
          uVar8 = uVar7 + 8;
          iVar14 = (int)uVar7;
          uVar7 = uVar8;
        } while (iVar14 + 0xc < width);
        lVar3 = (uVar8 & 0xffffffff) * 2;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(*pauVar12 + lVar13 * 2 + lVar3);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)(*pauVar12 + lVar3);
        auVar23 = vpunpcklqdq_avx(auVar47,auVar30);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(*pauVar12 + (long)(a_stride * 3) * 2 + lVar3);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(*pauVar12 + lVar6 * 2 + lVar3);
        auVar27 = vpunpcklqdq_avx(auVar46,auVar40);
        auVar34._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar27;
        auVar34._16_16_ = ZEXT116(1) * auVar23;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(*pauVar5 + lVar3);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)(*pauVar5 + lVar16 * 2 + lVar3);
        auVar23 = vpunpcklqdq_avx(auVar48,auVar49);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(*pauVar5 + (long)(b_stride * 3) * 2 + lVar3);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(*pauVar5 + lVar4 * 2 + lVar3);
        auVar27 = vpunpcklqdq_avx(auVar51,auVar50);
        auVar43._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar27;
        auVar43._16_16_ = ZEXT116(1) * auVar23;
        auVar31 = vpsubw_avx2(auVar34,auVar43);
        auVar31 = vpmaddwd_avx2(auVar31,auVar31);
        auVar24 = vpaddd_avx2(auVar31,auVar24);
        auVar31 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar31 = vpaddq_avx2(auVar22._0_32_,auVar31);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar31,auVar24);
        auVar22 = ZEXT3264(auVar24);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + lVar2);
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + lVar18);
        iVar11 = iVar11 + 4;
        puVar17 = puVar17 + lVar18;
        puVar19 = puVar19 + lVar18;
        puVar10 = puVar10 + lVar18;
        puVar20 = puVar20 + lVar2;
        puVar21 = puVar21 + lVar2;
        puVar15 = puVar15 + lVar2;
      } while (iVar11 < height);
    }
  }
LAB_00375129:
  auVar23 = vpaddq_avx(auVar24._0_16_,auVar24._16_16_);
  auVar27 = vpshufd_avx(auVar23,0xee);
  auVar23 = vpaddq_avx(auVar23,auVar27);
  return auVar23._0_8_;
}

Assistant:

int64_t aom_highbd_sse_avx2(const uint8_t *a8, int a_stride, const uint8_t *b8,
                            int b_stride, int width, int height) {
  int32_t y = 0;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  __m256i sum = _mm256_setzero_si256();
  switch (width) {
    case 4:
      do {
        highbd_sse_w4x4_avx2(&sum, a, a_stride, b, b_stride);
        a += a_stride << 2;
        b += b_stride << 2;
        y += 4;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 8:
      do {
        highbd_sse_w8x2_avx2(&sum, a, a_stride, b, b_stride);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 16:
      do {
        highbd_sse_w16_avx2(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 32:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16, b + 16);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 64 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 64;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    case 64:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16 * 1, b + 16 * 1);
          highbd_sse_w16_avx2(&sum32, a + 16 * 2, b + 16 * 2);
          highbd_sse_w16_avx2(&sum32, a + 16 * 3, b + 16 * 3);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 32 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 32;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    case 128:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16 * 1, b + 16 * 1);
          highbd_sse_w16_avx2(&sum32, a + 16 * 2, b + 16 * 2);
          highbd_sse_w16_avx2(&sum32, a + 16 * 3, b + 16 * 3);
          highbd_sse_w16_avx2(&sum32, a + 16 * 4, b + 16 * 4);
          highbd_sse_w16_avx2(&sum32, a + 16 * 5, b + 16 * 5);
          highbd_sse_w16_avx2(&sum32, a + 16 * 6, b + 16 * 6);
          highbd_sse_w16_avx2(&sum32, a + 16 * 7, b + 16 * 7);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 16 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 16;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    default:
      if (width & 0x7) {
        do {
          int i = 0;
          __m256i sum32 = _mm256_setzero_si256();
          do {
            highbd_sse_w8x2_avx2(&sum32, a + i, a_stride, b + i, b_stride);
            const uint16_t *a2 = a + i + (a_stride << 1);
            const uint16_t *b2 = b + i + (b_stride << 1);
            highbd_sse_w8x2_avx2(&sum32, a2, a_stride, b2, b_stride);
            i += 8;
          } while (i + 4 < width);
          highbd_sse_w4x4_avx2(&sum32, a + i, a_stride, b + i, b_stride);
          summary_32_avx2(&sum32, &sum);
          a += a_stride << 2;
          b += b_stride << 2;
          y += 4;
        } while (y < height);
      } else {
        do {
          int l = 0;
          __m256i sum32 = _mm256_setzero_si256();
          do {
            int i = 0;
            do {
              highbd_sse_w8x2_avx2(&sum32, a + i, a_stride, b + i, b_stride);
              i += 8;
            } while (i < width);
            a += a_stride << 1;
            b += b_stride << 1;
            l += 2;
          } while (l < 8 && l < (height - y));
          summary_32_avx2(&sum32, &sum);
          y += 8;
        } while (y < height);
      }
      sse = summary_4x64_avx2(sum);
      break;
  }
  return sse;
}